

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O3

void Js::HandleHelperOrLibraryMethodWrapperException<true>
               (ScriptContext *scriptContext,JavascriptExceptionObject *exceptionObject)

{
  code *pcVar1;
  int offset;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptExceptionObject *pJVar4;
  DebuggingFlags *this;
  FunctionBody *pFVar5;
  undefined1 local_48 [8];
  bool isTopUserFrameNative;
  int local_2c;
  int nextStatementOffset;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd3,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_008ac603;
    *puVar3 = 0;
  }
  if (exceptionObject == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd4,"(exceptionObject)","exceptionObject");
    if (!bVar2) goto LAB_008ac603;
    *puVar3 = 0;
  }
  if ((((exceptionObject->field_0x14 & 4) == 0) ||
      (pJVar4 = ThreadContext::GetPendingOOMErrorObject(scriptContext->threadContext),
      pJVar4 == exceptionObject)) ||
     (pJVar4 = ThreadContext::GetPendingSOErrorObject(scriptContext->threadContext),
     pJVar4 == exceptionObject)) {
LAB_008ac5f8:
    JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject,scriptContext);
  }
  bVar2 = JavascriptStackWalker::TryIsTopJavaScriptFrameNative(scriptContext,(bool *)local_48,true);
  if (bVar2) {
    if (local_48[0] == false) goto LAB_008ac5f8;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xe6,"(isTopUserFrameJavaScript)",
                                "How could we get non-javascript frame on exception?");
    if (!bVar2) goto LAB_008ac603;
    *puVar3 = 0;
  }
  if ((exceptionObject->field_0x14 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xf0,"(exceptionObject->IsDebuggerSkip())",
                                "exceptionObject->IsDebuggerSkip()");
    if (!bVar2) {
LAB_008ac603:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_2c = exceptionObject->byteCodeOffsetAfterDebuggerSkip;
  if (local_2c == -1) {
    pFVar5 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
    ByteCodeReader::Create
              ((ByteCodeReader *)local_48,pFVar5,
               (exceptionObject->exceptionContext).m_throwingFunctionByteCodeOffset);
    ScriptContext::GetDebugContext(scriptContext);
  }
  this = DebugManager::GetDebuggingFlags(scriptContext->threadContext->debugManager);
  offset = local_2c;
  pFVar5 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
  DebuggingFlags::SetByteCodeOffsetAndFuncAfterIgnoreException
            (this,offset,(pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber)
  ;
  return;
}

Assistant:

void HandleHelperOrLibraryMethodWrapperException(ScriptContext * scriptContext, JavascriptExceptionObject * exceptionObject)
    {
        Assert(scriptContext);
        Assert(exceptionObject);

        // Note: there also could be plain OutOfMemoryException and StackOverflowException, no special handling for these.
        if (!exceptionObject->IsDebuggerSkip() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingOOMErrorObject() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingSOErrorObject())
        {
            JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
        }

        if (doCheckParentInterpreterFrame)
        {
            // Note: JavascriptStackWalker is slow, but this is not hot path at all.
            // Note: we treat internal script code (such as Intl) as library code, thus
            //       ignore isLibraryCode=true callers.
            bool isTopUserFrameNative;
            bool isTopUserFrameJavaScript = Js::JavascriptStackWalker::TryIsTopJavaScriptFrameNative(
                scriptContext, &isTopUserFrameNative, /* ignoreLibraryCode = */ true);
            AssertMsg(isTopUserFrameJavaScript, "How could we get non-javascript frame on exception?");

            if (isTopUserFrameJavaScript && !isTopUserFrameNative)
            {
                // If parent frame is interpreter frame, it already has try-catch around all calls,
                // so that we don't need any special handling here.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        Assert(exceptionObject->IsDebuggerSkip());
        int nextStatementOffset;
        int offsetFromDebugger = exceptionObject->GetByteCodeOffsetAfterDebuggerSkip();
        if (offsetFromDebugger != DebuggingFlags::InvalidByteCodeOffset)
        {
            // The offset is already set for us by debugger (such as by set next statement).
            nextStatementOffset = offsetFromDebugger;
        }
        else
        {
            ByteCodeReader reader;
            reader.Create(exceptionObject->GetFunctionBody(), exceptionObject->GetByteCodeOffset());
            // Determine offset for next statement here.
            if (!scriptContext->GetDebugContext()->GetProbeContainer()->GetNextUserStatementOffsetForAdvance(
                exceptionObject->GetFunctionBody(), &reader, exceptionObject->GetByteCodeOffset(), &nextStatementOffset))
            {
                // Can't advance.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        // Continue after exception.
        // Note: for this scenario InterpreterStackFrame::DebugProcess resets its state,
        // looks like we don't need to that because we start with brand new interpreter frame.

        // Indicate to bailout check that we should bail out for/into debugger and set the byte code offset to one of next statement.
        scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetByteCodeOffsetAndFuncAfterIgnoreException(
            nextStatementOffset, exceptionObject->GetFunctionBody()->GetFunctionNumber());
    }